

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TextV(char *fmt,__va_list_tag *args)

{
  ImGuiContext *pIVar1;
  char *text_end;
  char *text;
  
  pIVar1 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  if (pIVar1->CurrentWindow->SkipItems == false) {
    ImFormatStringToTempBufferV(&text,&text_end,fmt,args);
    TextEx(text,text_end,1);
  }
  return;
}

Assistant:

void ImGui::TextV(const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    // FIXME-OPT: Handle the %s shortcut?
    const char* text, *text_end;
    ImFormatStringToTempBufferV(&text, &text_end, fmt, args);
    TextEx(text, text_end, ImGuiTextFlags_NoWidthForLargeClippedText);
}